

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O2

void __thiscall QComboBoxPrivate::returnPressed(QComboBoxPrivate *this)

{
  InsertPolicy IVar1;
  QComboBox *this_00;
  undefined8 uVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  MatchFlags flags;
  int iVar6;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_a8;
  QArrayDataPointer<char16_t> local_90;
  QArrayDataPointer<char16_t> local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->insertPolicy == NoInsert) || (this->lineEdit == (QLineEdit *)0x0)) goto LAB_003b1b48;
  this_00 = *(QComboBox **)&(this->super_QWidgetPrivate).field_0x8;
  QLineEdit::text((QString *)&local_58,this->lineEdit);
  uVar2 = local_58._16_8_;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
  if ((uVar2 == 0) ||
     ((iVar5 = QComboBox::count(this_00), this->maxCount <= iVar5 &&
      (this->insertPolicy != InsertAtCurrent)))) goto LAB_003b1b48;
  QLineEdit::deselect(this->lineEdit);
  QLineEdit::end(this->lineEdit,false);
  local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QLineEdit::text((QString *)&local_78,this->lineEdit);
  if ((this->field_0x34c & 2) == 0) {
    flags = matchFlags(this);
    iVar5 = QComboBox::findText(this_00,(QString *)&local_78,flags);
    if (iVar5 == -1) goto LAB_003b19b8;
    goto LAB_003b1b1a;
  }
LAB_003b19b8:
  iVar5 = 0;
  switch(this->insertPolicy) {
  case InsertAtCurrent:
  case InsertAfterCurrent:
  case InsertBeforeCurrent:
    iVar6 = QComboBox::count(this_00);
    iVar5 = 0;
    if ((iVar6 != 0) && (cVar3 = QPersistentModelIndex::isValid(), cVar3 != '\0')) {
      IVar1 = this->insertPolicy;
      if (IVar1 == InsertBeforeCurrent) {
        iVar5 = QComboBox::currentIndex(this_00);
      }
      else {
        if (IVar1 != InsertAfterCurrent) {
          if (IVar1 == InsertAtCurrent) {
            iVar5 = QComboBox::currentIndex(this_00);
            QComboBox::setItemText(this_00,iVar5,(QString *)&local_78);
          }
          break;
        }
        iVar5 = QComboBox::currentIndex(this_00);
        iVar5 = iVar5 + 1;
      }
      goto LAB_003b1ada;
    }
  case InsertAtTop:
switchD_003b19d7_caseD_1:
    local_58.shared = (PrivateShared *)0x0;
    local_58._8_8_ = 0;
    local_58._16_8_ = 0;
    local_40 = 2;
    QComboBox::insertItem(this_00,iVar5,(QString *)&local_78,(QVariant *)&local_58);
    ::QVariant::~QVariant((QVariant *)&local_58);
LAB_003b1b1a:
    QComboBox::setCurrentIndex(this_00,iVar5);
    QPersistentModelIndex::operator_cast_to_QModelIndex
              ((QModelIndex *)&local_58,&this->currentIndex);
    emitActivated(this,(QModelIndex *)&local_58);
    break;
  case InsertAtBottom:
    iVar5 = QComboBox::count(this_00);
    goto LAB_003b1ada;
  case InsertAlphabetically:
    for (iVar5 = 0; iVar6 = QComboBox::count(this_00), iVar5 < iVar6; iVar5 = iVar5 + 1) {
      QString::toLower_helper((QString *)local_58.data);
      QComboBox::itemText((QString *)&QStack_a8,this_00,iVar5);
      QString::toLower_helper((QString *)&local_90);
      bVar4 = ::operator<((QString *)&local_58,(QString *)&local_90);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_a8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
      if (bVar4) break;
    }
LAB_003b1ada:
    if (-1 < iVar5) goto switchD_003b19d7_caseD_1;
    break;
  default:
    break;
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
LAB_003b1b48:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QComboBoxPrivate::returnPressed()
{
    Q_Q(QComboBox);

    // The insertion code below does not apply when the policy is QComboBox::NoInsert.
    // In case a completer is installed, item activation via the completer is handled
    // in completerActivated(). Otherwise editingFinished() updates the current
    // index as appropriate.
    if (insertPolicy == QComboBox::NoInsert)
        return;

    if (lineEdit && !lineEdit->text().isEmpty()) {
        if (q->count() >= maxCount && !(this->insertPolicy == QComboBox::InsertAtCurrent))
            return;
        lineEdit->deselect();
        lineEdit->end(false);
        QString text = lineEdit->text();
        // check for duplicates (if not enabled) and quit
        int index = -1;
        if (!duplicatesEnabled) {
            index = q->findText(text, matchFlags());
            if (index != -1) {
                q->setCurrentIndex(index);
                emitActivated(currentIndex);
                return;
            }
        }
        switch (insertPolicy) {
        case QComboBox::InsertAtTop:
            index = 0;
            break;
        case QComboBox::InsertAtBottom:
            index = q->count();
            break;
        case QComboBox::InsertAtCurrent:
        case QComboBox::InsertAfterCurrent:
        case QComboBox::InsertBeforeCurrent:
            if (!q->count() || !currentIndex.isValid())
                index = 0;
            else if (insertPolicy == QComboBox::InsertAtCurrent)
                q->setItemText(q->currentIndex(), text);
            else if (insertPolicy == QComboBox::InsertAfterCurrent)
                index = q->currentIndex() + 1;
            else if (insertPolicy == QComboBox::InsertBeforeCurrent)
                index = q->currentIndex();
            break;
        case QComboBox::InsertAlphabetically:
            index = 0;
            for (int i = 0; i < q->count(); ++i, ++index) {
                if (text.toLower() < q->itemText(i).toLower())
                    break;
            }
            break;
        default:
            break;
        }
        if (index >= 0) {
            q->insertItem(index, text);
            q->setCurrentIndex(index);
            emitActivated(currentIndex);
        }
    }
}